

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock,
          char *pageAddress,HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,
          Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 *in_FS_OFFSET;
  BVStatic<256UL> *local_40;
  
  if (heapBlock == (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_00217c31;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).super_HeapBlock.
      heapBlockType != blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar3) goto LAB_00217c31;
    *puVar1 = 0;
  }
  pcVar6 = (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).super_HeapBlock.
           address;
  if (this->map[(ulong)pcVar6 >> 0x14 & 0xfff] == (L2MapChunk *)0x0) {
    local_40 = (BVStatic<256UL> *)0x0;
  }
  else {
    local_40 = BVStatic<65536ul>::GetRange<256ul>
                         ((BVStatic<65536ul> *)this->map[(ulong)pcVar6 >> 0x14 & 0xfff],
                          (uint)pcVar6 >> 4 & 0xff00);
  }
  pcVar6 = (char *)((ulong)pageAddress & 0xfffffffffffff000);
  if (pcVar6 != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar3) {
LAB_00217c31:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetPageCount
                    (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>);
  bVar3 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      bVar4 = SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
              ::RescanObjectsOnPage
                        (heapBlock,pcVar6 + (uint)((int)uVar7 << 0xc),pcVar6,local_40,
                         bucketIndex * 0x10 + 0x10,bucketIndex,(bool *)0x0,recycler);
      if (!bVar4) {
        HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
      }
      bVar4 = Recycler::NeedOOMRescan(recycler);
      if (bVar4) {
        return bVar3;
      }
      uVar7 = uVar7 + 1;
      bVar3 = uVar5 <= uVar7;
    } while (uVar7 != uVar5);
  }
  this->anyHeapBlockRescannedDuringOOM = true;
  return bVar3;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}